

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::TYA(CPU *this)

{
  uint8_t uVar1;
  byte bVar2;
  
  uVar1 = this->Y;
  this->A = uVar1;
  if (uVar1 == '\0') {
    bVar2 = this->field_0x2e | 0x40;
  }
  else {
    bVar2 = this->field_0x2e & 0xbf;
    if ((char)uVar1 < '\0') {
      bVar2 = bVar2 | 1;
      goto LAB_00110059;
    }
  }
  bVar2 = bVar2 & 0xfe;
LAB_00110059:
  this->field_0x2e = bVar2;
  return;
}

Assistant:

void CPU::TYA() {
	A = Y;
	if (A == 0) {
		Z = 1;
	} else {
		Z = 0;
	}
	if (A & (1 << 7)) {
		N = 1;
	} else {
		N = 0;
	}
}